

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.hpp
# Opt level: O0

void __thiscall czh::lexer::NumberMatch::next(NumberMatch *this,Token *token)

{
  Token TVar1;
  Token *token_local;
  NumberMatch *this_local;
  
  switch(this->state) {
  case INIT:
    TVar1 = *token;
    if (TVar1 == INT) {
      this->state = INT;
    }
    else if (TVar1 == DOT) {
      this->state = DOT_NO_INT;
    }
    else if (TVar1 == SIGN) {
      this->state = SIGN;
    }
    else {
      this->state = UNEXPECTED;
    }
    break;
  case INT:
    switch(*token) {
    case INT:
      break;
    case DOT:
      this->state = DOT;
      break;
    default:
      this->state = UNEXPECTED;
      break;
    case EXP:
      this->state = EXP;
      break;
    case END:
      this->state = END;
    }
    break;
  case INT_DOT:
    TVar1 = *token;
    if (TVar1 != INT) {
      if (TVar1 == EXP) {
        this->state = EXP;
      }
      else if (TVar1 == END) {
        this->state = END;
      }
      else {
        this->state = UNEXPECTED;
      }
    }
    break;
  case SIGN:
    if (*token == INT) {
      this->state = INT;
    }
    else if (*token == DOT) {
      this->state = DOT_NO_INT;
    }
    else {
      this->state = UNEXPECTED;
    }
    break;
  case DOT:
    TVar1 = *token;
    if (TVar1 == INT) {
      this->state = INT_DOT;
    }
    else if (TVar1 == EXP) {
      this->state = EXP;
    }
    else if (TVar1 == END) {
      this->state = END;
    }
    else {
      this->state = UNEXPECTED;
    }
    break;
  case DOT_NO_INT:
    if (*token == INT) {
      this->state = INT_DOT;
    }
    else {
      this->state = UNEXPECTED;
    }
    break;
  case EXP:
    if (*token == INT) {
      this->state = EXP_INT;
    }
    else if (*token == SIGN) {
      this->state = EXP_SIGN;
    }
    else {
      this->state = UNEXPECTED;
    }
    break;
  case EXP_SIGN:
    if (*token == INT) {
      this->state = EXP_INT;
    }
    else {
      this->state = UNEXPECTED;
    }
    break;
  case EXP_INT:
    if (*token != INT) {
      if (*token == END) {
        this->state = END;
      }
      else {
        this->state = UNEXPECTED;
      }
    }
    break;
  default:
    this->state = UNEXPECTED;
  }
  return;
}

Assistant:

void next(const Token &token)
    {
      switch (state)
      {
        case State::INIT:
          switch (token)
          {
            case Token::INT:
              state = State::INT;
              break;
            case Token::DOT:
              state = State::DOT_NO_INT;
              break;
            case Token::SIGN:
              state = State::SIGN;
              break;
            default:
              state = State::UNEXPECTED;
              break;
          }
          break;
        case State::SIGN:
          switch (token)
          {
            case Token::INT:
              state = State::INT;
              break;
            case Token::DOT:
              state = State::DOT_NO_INT;
              break;
            default:
              state = State::UNEXPECTED;
              break;
          }
          break;
        case State::INT:
          switch (token)
          {
            case Token::INT:
              break;
            case Token::DOT:
              state = State::DOT;
              break;
            case Token::EXP:
              state = State::EXP;
              break;
            case Token::END:
              state = State::END;
              break;
            default:
              state = State::UNEXPECTED;
              break;
          }
          break;
        case State::INT_DOT:
          switch (token)
          {
            case Token::INT:
              break;
            case Token::EXP:
              state = State::EXP;
              break;
            case Token::END:
              state = State::END;
              break;
            default:
              state = State::UNEXPECTED;
              break;
          }
          break;
        case State::DOT_NO_INT:
          switch (token)
          {
            case Token::INT:
              state = State::INT_DOT;
              break;
            default:
              state = State::UNEXPECTED;
              break;
          }
          break;
        case State::DOT:
          switch (token)
          {
            case Token::INT:
              state = State::INT_DOT;
              break;
            case Token::EXP:
              state = State::EXP;
              break;
            case Token::END:
              state = State::END;
              break;
            default:
              state = State::UNEXPECTED;
              break;
          }
          break;
        case State::EXP:
          switch (token)
          {
            case Token::INT:
              state = State::EXP_INT;
              break;
            case Token::SIGN:
              state = State::EXP_SIGN;
              break;
            default:
              state = State::UNEXPECTED;
              break;
          }
          break;
        case State::EXP_SIGN:
          switch (token)
          {
            case Token::INT:
              state = State::EXP_INT;
              break;
            default:
              state = State::UNEXPECTED;
              break;
          }
          break;
        case State::EXP_INT:
          switch (token)
          {
            case Token::INT:
              break;
            case Token::END:
              state = State::END;
              break;
            default:
              state = State::UNEXPECTED;
              break;
          }
          break;
        default:
          state = State::UNEXPECTED;
          break;
      }
    }